

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O0

QList<int> * qglx_buildSpec(QSurfaceFormat *format,int drawableBit,int flags)

{
  bool bVar1;
  SwapBehavior SVar2;
  int iVar3;
  QList<int> *pQVar4;
  uint in_ECX;
  QSurfaceFormat *in_RSI;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QList<int> *spec;
  undefined4 in_stack_ffffffffffffff48;
  parameter_type in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  byte local_99;
  undefined8 in_stack_ffffffffffffff70;
  NamedColorSpace namedColorSpace;
  QList<int> *in_stack_ffffffffffffff78;
  int local_28 [3];
  int local_1c;
  int local_18 [3];
  int local_c;
  long local_8;
  
  namedColorSpace = (NamedColorSpace)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0xa8e7d8);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  local_c = 1;
  local_18[2] = QSurfaceFormat::redBufferSize(in_RSI);
  qMax<int>(&local_c,local_18 + 2);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  local_18[1] = 1;
  local_18[0] = QSurfaceFormat::greenBufferSize(in_RSI);
  qMax<int>(local_18 + 1,local_18);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  local_1c = 1;
  local_28[2] = QSurfaceFormat::blueBufferSize(in_RSI);
  qMax<int>(&local_1c,local_28 + 2);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  local_28[1] = 0;
  local_28[0] = QSurfaceFormat::alphaBufferSize(in_RSI);
  qMax<int>(local_28 + 1,local_28);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  SVar2 = QSurfaceFormat::swapBehavior(in_RSI);
  if (SVar2 != SingleBuffer) {
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
  }
  bVar1 = QSurfaceFormat::stereo((QSurfaceFormat *)0xa8e97c);
  if (bVar1) {
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
  }
  iVar3 = QSurfaceFormat::depthBufferSize(in_RSI);
  if (iVar3 != -1) {
    in_stack_ffffffffffffff78 =
         QList<int>::operator<<
                   ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff4c);
    QSurfaceFormat::depthBufferSize(in_RSI);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
  }
  iVar3 = QSurfaceFormat::stencilBufferSize(in_RSI);
  if (iVar3 != -1) {
    pQVar4 = QList<int>::operator<<
                       ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff4c);
    namedColorSpace = (NamedColorSpace)((ulong)pQVar4 >> 0x20);
    QSurfaceFormat::stencilBufferSize(in_RSI);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
  }
  iVar3 = QSurfaceFormat::samples(in_RSI);
  if (1 < iVar3) {
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
    QSurfaceFormat::samples(in_RSI);
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff4c);
  }
  local_99 = 0;
  if ((in_ECX & 1) != 0) {
    QSurfaceFormat::colorSpace(in_RSI);
    QColorSpace::QColorSpace((QColorSpace *)in_stack_ffffffffffffff78,namedColorSpace);
    local_99 = operator==((QColorSpace *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (QColorSpace *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    QColorSpace::~QColorSpace((QColorSpace *)0xa8ead4);
  }
  if ((local_99 & 1) != 0) {
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(local_99,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c)
    ;
    QList<int>::operator<<
              ((QList<int> *)CONCAT17(local_99,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c)
    ;
  }
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(local_99,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(local_99,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
  QList<int>::operator<<
            ((QList<int> *)CONCAT17(local_99,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> qglx_buildSpec(const QSurfaceFormat &format, int drawableBit, int flags)
{
    QList<int> spec;

    spec << GLX_LEVEL
         << 0

         << GLX_RENDER_TYPE
         << GLX_RGBA_BIT

         << GLX_RED_SIZE
         << qMax(1, format.redBufferSize())

         << GLX_GREEN_SIZE
         << qMax(1, format.greenBufferSize())

         << GLX_BLUE_SIZE
         << qMax(1, format.blueBufferSize())

         << GLX_ALPHA_SIZE
         << qMax(0, format.alphaBufferSize());

    if (format.swapBehavior() != QSurfaceFormat::SingleBuffer)
        spec << GLX_DOUBLEBUFFER
             << True;

    if (format.stereo())
        spec << GLX_STEREO
             << True;

    if (format.depthBufferSize() != -1)
        spec << GLX_DEPTH_SIZE
             << format.depthBufferSize();

    if (format.stencilBufferSize() != -1)
        spec << GLX_STENCIL_SIZE
             << format.stencilBufferSize();

    if (format.samples() > 1)
        spec << GLX_SAMPLE_BUFFERS_ARB
             << 1
             << GLX_SAMPLES_ARB
             << format.samples();

    if ((flags & QGLX_SUPPORTS_SRGB) && format.colorSpace() == QColorSpace::SRgb)
        spec << GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB
             << True;

    spec << GLX_DRAWABLE_TYPE
         << drawableBit

         << XNone;

    return spec;
}